

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp.c
# Opt level: O1

void tcptran_ep_fini(void *arg)

{
  nni_aio_fini((nni_aio *)((long)arg + 0x218));
  nni_aio_fini((nni_aio *)((long)arg + 0x50));
  nng_stream_dialer_free(*(nng_stream_dialer **)((long)arg + 0x410));
  nng_stream_listener_free(*(nng_stream_listener **)((long)arg + 0x418));
  nni_mtx_fini((nni_mtx *)arg);
  return;
}

Assistant:

static void
tcptran_ep_fini(void *arg)
{
	tcptran_ep *ep = arg;

	nni_aio_fini(&ep->timeaio);
	nni_aio_fini(&ep->connaio);
	nng_stream_dialer_free(ep->dialer);
	nng_stream_listener_free(ep->listener);
	nni_mtx_fini(&ep->mtx);
}